

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O1

int jaegertracing::net::anon_unknown_1::decodeHex(char ch)

{
  int iVar1;
  
  iVar1 = -0x30;
  if ((9 < (byte)(ch - 0x30U)) && (iVar1 = -0x37, 5 < (byte)(ch + 0xbfU))) {
    iVar1 = -0x57;
    if (5 < (byte)(ch + 0x9fU)) {
      __assert_fail("ch >= \'a\' && ch <= \'f\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/net/URI.cpp"
                    ,0x2c,"int jaegertracing::net::(anonymous namespace)::decodeHex(char)");
    }
  }
  return ch + iVar1;
}

Assistant:

int decodeHex(char ch)
{
    if (ch >= '0' && ch <= '9') {
        return ch - '0';
    }
    if (ch >= 'A' && ch <= 'F') {
        return ch - 'A' + 10;
    }
    assert(ch >= 'a' && ch <= 'f');
    return ch - 'a' + 10;
}